

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitonicsort.hpp
# Opt level: O0

void mxx::impl::
     bitonic_sort_rec<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
               (undefined8 begin,undefined8 end,comm *param_3,int param_4,int param_5,byte param_6)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  undefined4 local_40;
  int pend;
  int pmid;
  int p2;
  bool dir_local;
  int size_local;
  int pbeg_local;
  comm *comm_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  end_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  begin_local;
  
  param_6 = param_6 & 1;
  dVar4 = log((double)param_5);
  dVar5 = log(2.0);
  dVar4 = ceil(dVar4 / dVar5);
  dVar4 = pow(2.0,dVar4);
  iVar1 = (int)dVar4;
  iVar2 = param_4 + iVar1 / 2;
  local_40 = param_4 + iVar1;
  iVar3 = mxx::comm::size(param_3);
  if (iVar3 < local_40) {
    local_40 = mxx::comm::size(param_3);
  }
  if (1 < local_40 - param_4) {
    iVar3 = mxx::comm::rank(param_3);
    if (iVar3 < iVar2) {
      bitonic_sort_rec<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
                (begin,end,param_3,param_4,(long)iVar1 / 2 & 0xffffffff,(param_6 ^ 0xff) & 1);
    }
    else {
      bitonic_sort_rec<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
                (begin,end,param_3,iVar2,param_5 - iVar1 / 2,param_6);
    }
    bitonic_merge<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
              (begin,end,param_3,param_4,local_40,param_6);
  }
  return;
}

Assistant:

void bitonic_sort_rec(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm, int pbeg, int size, bool dir) {

    // get next power of two
    int p2 = pow(2, ceil(log(size)/log(2)));

    // determine where the two sub-recursions are
    int pmid = pbeg + p2/2;
    int pend = pbeg + p2;
    if (pend > comm.size())
        pend = comm.size();
    // recursive base-case
    if (pend - pbeg <= 1)
        return;

    // sort the two subsequences, where the first is always a power of 2
    if (comm.rank() < pmid) {
        // sort descending
        bitonic_sort_rec(begin, end, comp, comm, pbeg, p2/2, !dir);
    } else {
        // sort ascending
        bitonic_sort_rec(begin, end, comp, comm, pmid, size - p2/2, dir);
    }
    // merge bitonic decreasing sequence
    bitonic_merge(begin, end, comp, comm, pbeg, pend, dir);
}